

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_16::NameResolver::ResolveLabelVar(NameResolver *this,Var *var)

{
  bool bVar1;
  __type _Var2;
  size_type sVar3;
  reference __lhs;
  string *__rhs;
  undefined8 uVar4;
  string *label;
  int i;
  Var *var_local;
  NameResolver *this_local;
  
  bVar1 = Var::is_name(var);
  if (bVar1) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->labels_);
    label._4_4_ = (int)sVar3;
    do {
      label._4_4_ = label._4_4_ + -1;
      if (label._4_4_ < 0) {
        Var::name_abi_cxx11_(var);
        uVar4 = std::__cxx11::string::c_str();
        PrintError(this,&var->loc,"undefined label variable \"%s\"",uVar4);
        return;
      }
      __lhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&this->labels_,(long)label._4_4_);
      __rhs = Var::name_abi_cxx11_(var);
      _Var2 = std::operator==(__lhs,__rhs);
    } while (!_Var2);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->labels_);
    Var::set_index(var,((int)sVar3 - label._4_4_) - 1);
  }
  return;
}

Assistant:

void NameResolver::ResolveLabelVar(Var* var) {
  if (var->is_name()) {
    for (int i = labels_.size() - 1; i >= 0; --i) {
      const std::string& label = labels_[i];
      if (label == var->name()) {
        var->set_index(labels_.size() - i - 1);
        return;
      }
    }
    PrintError(&var->loc, "undefined label variable \"%s\"",
               var->name().c_str());
  }
}